

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_log_add_fd(int fd,float sample_ratio,char *_points,char *_snis,char *_addresses,int appdata
                   )

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  char *__ptr;
  char *__ptr_00;
  size_t sVar4;
  void *__ptr_01;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  in_addr v4;
  undefined4 local_34;
  
  pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  __ptr = duplicate_stringlist(_points);
  if ((__ptr == (char *)0x0) || (__ptr_00 = duplicate_stringlist(_snis), __ptr_00 == (char *)0x0)) {
    __ptr_00 = (char *)0x0;
  }
  else if (_addresses == (char *)0x0) {
    __ptr_01 = malloc(0x10);
    lVar5 = 0;
    if (__ptr_01 != (void *)0x0) goto LAB_00117fbc;
  }
  else {
    if (*_addresses == '\0') {
      sVar7 = 0x10;
    }
    else {
      sVar7 = 0x10;
      pcVar6 = _addresses;
      do {
        sVar4 = strlen(pcVar6);
        pcVar6 = pcVar6 + sVar4 + 1;
        sVar7 = sVar7 + 0x10;
      } while (*pcVar6 != '\0');
    }
    __ptr_01 = malloc(sVar7);
    if (__ptr_01 != (void *)0x0) {
      if ((_addresses == (char *)0x0) || (*_addresses == '\0')) {
        lVar5 = 0;
      }
      else {
        lVar5 = 0;
        do {
          pcVar6 = (char *)(lVar5 * 0x10 + (long)__ptr_01);
          iVar3 = inet_pton(10,_addresses,pcVar6);
          if (iVar3 == 0) {
            iVar3 = inet_pton(2,_addresses,&local_34);
            if (iVar3 != 0) {
              pcVar6[0] = '\0';
              pcVar6[1] = '\0';
              pcVar6[2] = '\0';
              pcVar6[3] = '\0';
              pcVar6[4] = '\0';
              pcVar6[5] = '\0';
              pcVar6[6] = '\0';
              pcVar6[7] = '\0';
              pcVar6[8] = '\0';
              pcVar6[9] = '\0';
              pcVar6[10] = -1;
              pcVar6[0xb] = -1;
              *(undefined4 *)(pcVar6 + 0xc) = local_34;
              goto LAB_00117f75;
            }
          }
          else {
LAB_00117f75:
            auVar8[0] = -(in6addr_any == *pcVar6);
            auVar8[1] = -(cRam00000000001383a9 == pcVar6[1]);
            auVar8[2] = -(cRam00000000001383aa == pcVar6[2]);
            auVar8[3] = -(cRam00000000001383ab == pcVar6[3]);
            auVar8[4] = -(cRam00000000001383ac == pcVar6[4]);
            auVar8[5] = -(cRam00000000001383ad == pcVar6[5]);
            auVar8[6] = -(cRam00000000001383ae == pcVar6[6]);
            auVar8[7] = -(cRam00000000001383af == pcVar6[7]);
            auVar8[8] = -(EVP_aes_128_ecb == (code)pcVar6[8]);
            auVar8[9] = -(cRam00000000001383b1 == pcVar6[9]);
            auVar8[10] = -(cRam00000000001383b2 == pcVar6[10]);
            auVar8[0xb] = -(cRam00000000001383b3 == pcVar6[0xb]);
            auVar8[0xc] = -(cRam00000000001383b4 == pcVar6[0xc]);
            auVar8[0xd] = -(cRam00000000001383b5 == pcVar6[0xd]);
            auVar8[0xe] = -(cRam00000000001383b6 == pcVar6[0xe]);
            auVar8[0xf] = -(cRam00000000001383b7 == pcVar6[0xf]);
            lVar5 = lVar5 + (ulong)((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                             (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                            (ushort)(auVar8[0xf] >> 7) << 0xf) != 0xffff);
          }
          sVar7 = strlen(_addresses);
          _addresses = _addresses + sVar7 + 1;
        } while (*_addresses != '\0');
      }
LAB_00117fbc:
      uVar2 = CONCAT17(cRam00000000001383b7,
                       CONCAT16(cRam00000000001383b6,
                                CONCAT15(cRam00000000001383b5,
                                         CONCAT14(cRam00000000001383b4,
                                                  CONCAT13(cRam00000000001383b3,
                                                           CONCAT12(cRam00000000001383b2,
                                                                    CONCAT11(cRam00000000001383b1,
                                                                             EVP_aes_128_ecb)))))));
      puVar1 = (undefined8 *)((long)__ptr_01 + lVar5 * 0x10);
      *puVar1 = CONCAT17(cRam00000000001383af,
                         CONCAT16(cRam00000000001383ae,
                                  CONCAT15(cRam00000000001383ad,
                                           CONCAT14(cRam00000000001383ac,
                                                    CONCAT13(cRam00000000001383ab,
                                                             CONCAT12(cRam00000000001383aa,
                                                                      CONCAT11(cRam00000000001383a9,
                                                                               in6addr_any)))))));
      puVar1[1] = uVar2;
      lVar5 = 0x24;
      do {
        if (*(long *)((long)ptls_openssl_hpke_cipher_suites + lVar5 + 0x14) == 0) {
          *(int *)((long)ptls_openssl_hpke_cipher_suites + lVar5 + 0xc) = fd;
          *(char **)((long)ptls_openssl_hpke_cipher_suites + lVar5 + 0x14) = __ptr;
          *(char **)((long)ptls_openssl_hpke_cipher_suites + lVar5 + 0x1c) = __ptr_00;
          *(void **)((long)ptls_openssl_hpke_cipher_suites + lVar5 + 0x24) = __ptr_01;
          *(float *)(lVar5 + 0x13773c) = sample_ratio;
          *(byte *)((long)&logctx.conns[0].fd + lVar5) =
               *(byte *)((long)&logctx.conns[0].fd + lVar5) & 0xfe | (byte)appdata & 1;
          ptls_log._generation = ptls_log._generation + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
          return 0;
        }
        lVar5 = lVar5 + 0x28;
      } while (lVar5 != 0x524);
      goto LAB_00117ead;
    }
  }
  __ptr_01 = (void *)0x0;
LAB_00117ead:
  pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return 0x201;
}

Assistant:

int ptls_log_add_fd(int fd, float sample_ratio, const char *_points, const char *_snis, const char *_addresses, int appdata)
{
#if PTLS_HAVE_LOG

    char *points = NULL, *snis = NULL;
    struct in6_addr *addresses = NULL;
    int ret;

    pthread_mutex_lock(&logctx.mutex);

    if ((points = duplicate_stringlist(_points)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((snis = duplicate_stringlist(_snis)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    {
        size_t num_addresses = 0;
        for (const char *input = _addresses; input != NULL && *input != '\0'; input += strlen(input) + 1)
            ++num_addresses;
        if ((addresses = malloc(sizeof(*addresses) * (num_addresses + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        size_t index = 0;
        for (const char *input = _addresses; input != NULL && *input != '\0'; input += strlen(input) + 1) {
            /* note: for consistency to the handling of points, erroneous input is ignored. V4 addresses will use the mapped form
             * (::ffff:192.0.2.1) */
            if (!inet_pton(AF_INET6, input, &addresses[index])) {
                struct in_addr v4;
                if (!inet_pton(AF_INET, input, &v4))
                    continue;
                ptls_build_v4_mapped_v6_address(&addresses[index], &v4);
            }
            if (memcmp(&addresses[index], &in6addr_any, sizeof(struct in6_addr)) == 0)
                continue;
            ++index;
        }
        addresses[index] = in6addr_any;
    }

    /* find slot, or return if not available */
    size_t slot_index;
    for (slot_index = 0; slot_index < PTLS_ELEMENTSOF(logctx.conns); ++slot_index)
        if (logctx.conns[slot_index].points == NULL)
            break;
    if (slot_index == PTLS_ELEMENTSOF(logctx.conns)) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* setup the slot */
    logctx.conns[slot_index].fd = fd;
    logctx.conns[slot_index].points = points;
    logctx.conns[slot_index].snis = snis;
    logctx.conns[slot_index].addresses = addresses;
    logctx.conns[slot_index].sample_ratio = sample_ratio;
    logctx.conns[slot_index].appdata = appdata;
    ++ptls_log._generation;

    ret = 0; /* success */

Exit:
    pthread_mutex_unlock(&logctx.mutex);
    if (ret != 0) {
        free(points);
        free(snis);
        free(addresses);
    }
    return ret;

#else
    return PTLS_ERROR_NOT_AVAILABLE;
#endif
}